

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BerdyHelper.cpp
# Opt level: O2

IndexRange __thiscall
iDynTree::BerdyHelper::getRangeJointWrenchDynEqFixedBase(BerdyHelper *this,JointIndex idx)

{
  TraversalIndex TVar1;
  IndexRange IVar2;
  
  if ((this->m_options).berdyVariant == ORIGINAL_BERDY_FIXED_BASE) {
    TVar1 = getTraversalIndexFromJointIndex(&this->m_model,&this->m_dynamicsTraversal,idx);
    IVar2.size = 6;
    IVar2.offset = TVar1 * 0x13 + -7;
  }
  else {
    IVar2 = (IndexRange)iDynTree::IndexRange::InvalidRange();
  }
  return IVar2;
}

Assistant:

IndexRange BerdyHelper::getRangeJointWrenchDynEqFixedBase(const JointIndex idx) const
{
    IndexRange ret;

    if( m_options.berdyVariant == ORIGINAL_BERDY_FIXED_BASE )
    {
        TraversalIndex trvIdx = getTraversalIndexFromJointIndex(m_model,m_dynamicsTraversal,idx);
        ret.offset = 19*(trvIdx-1)+12;
        ret.size = 6;
        return ret;
    }

    return IndexRange::InvalidRange();
}